

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O2

double __thiscall
despot::PocmanApproxScenarioUpperBound::Value
          (PocmanApproxScenarioUpperBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  pointer ppSVar1;
  State *pSVar2;
  char cVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  int g;
  long lVar9;
  long lVar10;
  int i;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  reference rVar17;
  double local_88;
  double local_80;
  double local_68;
  undefined8 local_40;
  Coord ghost_pos;
  
  local_68 = 0.0;
  uVar7 = 0;
  do {
    ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(particles->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar7) {
      return local_68;
    }
    pSVar2 = ppSVar1[uVar7];
    local_88 = 0.0;
    iVar11 = 0;
    for (uVar12 = 0;
        uVar12 < (ulong)*(uint *)(pSVar2 + 0x70) +
                 (*(long *)(pSVar2 + 0x68) - *(long *)(pSVar2 + 0x58)) * 8; uVar12 = uVar12 + 1) {
      rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)(pSVar2 + 0x58),uVar12);
      if ((*rVar17._M_p & rVar17._M_mask) != 0) {
        uVar5 = Grid<int>::GetCoord(&this->pocman_->maze_,(int)uVar12);
        iVar4 = despot::Coord::ManhattanDistance(*(undefined8 *)(pSVar2 + 0x20),uVar5);
        dVar16 = this->pocman_->reward_eat_food_;
        dVar13 = pow(___cxa_finalize,(double)iVar4);
        local_88 = local_88 + dVar13 * dVar16;
        if (iVar11 <= iVar4) {
          iVar11 = iVar4;
        }
      }
    }
    dVar16 = this->pocman_->reward_clear_level_;
    dVar15 = (double)iVar11;
    dVar14 = pow(___cxa_finalize,dVar15);
    dVar13 = this->pocman_->reward_default_;
    if (___cxa_finalize < 1.0) {
      dVar15 = pow(___cxa_finalize,dVar15);
      dVar15 = (1.0 - dVar15) / (1.0 - ___cxa_finalize);
    }
    local_80 = dVar16 * dVar14 + local_88 + dVar13 * dVar15;
    if ((((0 < *(int *)(pSVar2 + 0x84)) && (*(long *)(history + 8) != *(long *)history)) &&
        ((*(ulong *)(*(long *)(history + 0x20) + -8) & 0xf) != 0)) &&
       (uVar12 = (ulong)*(int *)(*(long *)(history + 8) + -4),
       (*(ulong *)(*(long *)(history + 0x20) + -8) >> (uVar12 & 0x3f) & 1) != 0)) {
      bVar8 = false;
      iVar11 = 1;
      while (!bVar8) {
        local_40 = despot::Coord::operator*((Coord *)(&Compass::DIRECTIONS + uVar12),iVar11);
        _ghost_pos = despot::operator+((Coord *)(pSVar2 + 0x20),(Coord *)&local_40);
        lVar9 = -1;
        lVar10 = 0;
        do {
          lVar6 = (long)this->pocman_->num_ghosts_;
          lVar9 = lVar9 + 1;
          bVar8 = lVar9 < lVar6;
          if (lVar6 <= lVar9) goto LAB_0010d8bf;
          cVar3 = despot::operator==((Coord *)(lVar10 + *(long *)(pSVar2 + 0x28)),&ghost_pos);
          lVar10 = lVar10 + 8;
        } while (cVar3 == '\0');
        dVar16 = this->pocman_->reward_eat_ghost_;
        dVar13 = pow(___cxa_finalize,(double)iVar11);
        local_80 = local_80 + dVar13 * dVar16;
LAB_0010d8bf:
        iVar11 = iVar11 + 1;
      }
    }
    dVar16 = 0.0;
    lVar9 = 0;
    while( true ) {
      iVar11 = this->pocman_->num_ghosts_;
      if (iVar11 <= lVar9) break;
      iVar11 = despot::Coord::ManhattanDistance
                         (*(undefined8 *)(pSVar2 + 0x20),
                          *(undefined8 *)(*(long *)(pSVar2 + 0x28) + lVar9 * 8));
      dVar16 = dVar16 + (double)iVar11;
      lVar9 = lVar9 + 1;
    }
    dVar13 = this->pocman_->reward_die_;
    dVar16 = pow(___cxa_finalize,dVar16 / (double)iVar11);
    local_80 = dVar16 * dVar13 + local_80;
    uVar12 = *(long *)(history + 8) - *(long *)history;
    if ((4 < uVar12) &&
       (iVar11 = despot::Compass::Opposite
                           (*(int *)(*(long *)history +
                                    ((long)(uVar12 * 0x40000000 + -0x100000000) >> 0x20) * 4)),
       iVar11 == *(int *)(*(long *)history +
                         ((*(long *)(history + 8) - *(long *)history) * 0x40000000 + -0x200000000 >>
                         0x20) * 4))) {
      local_80 = local_80 + this->pocman_->reward_hit_wall_ * 0.5;
    }
    local_68 = local_68 + local_80 * *(double *)(pSVar2 + 0x18);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

double Value(const vector<State*>& particles,
		RandomStreams& streams, History& history) const {
		double total_value = 0;
		for (int i = 0; i < particles.size(); i++) {
			PocmanState& state = static_cast<PocmanState&>(*(particles[i]));
			double value = 0;

			int max_dist = 0;

			for (int i = 0; i < state.food.size(); i++) {
				if (state.food[i] != 1)
					continue;
				Coord food_pos = pocman_->maze_.GetCoord(i);
				int dist = Coord::ManhattanDistance(state.pocman_pos, food_pos);
				value += pocman_->reward_eat_food_ * Globals::Discount(dist);
				max_dist = max(max_dist, dist);
			}

			// Clear level
			value += pocman_->reward_clear_level_ * pow(Globals::config.discount, max_dist);

			// Default move-reward
			value += pocman_->reward_default_ * (Globals::Discount() < 1
					? (1 - Globals::Discount(max_dist)) / (1 - Globals::Discount())
					: max_dist);

			// If pocman is chasing a ghost, encourage it
			if (state.power_steps > 0 && history.Size() &&
					(history.LastObservation() & 15) != 0) {
				int act = history.LastAction();
				int obs = history.LastObservation();
				if (CheckFlag(obs, act)) {
					bool seen_ghost = false;
					for (int dist = 1; !seen_ghost; dist++) {
						Coord ghost_pos = state.pocman_pos + Compass::DIRECTIONS[act] * dist;
						for (int g = 0; g < pocman_->num_ghosts_; g++)
							if (state.ghost_pos[g] == ghost_pos) {
								value += pocman_->reward_eat_ghost_ * Globals::Discount(dist);
								seen_ghost = true;
								break;
							}
					}
				}
			}

			// Ghost penalties
			double dist = 0;
			for (int g = 0; g < pocman_->num_ghosts_; g++)
				dist += Coord::ManhattanDistance(state.pocman_pos, state.ghost_pos[g]);
			value += pocman_->reward_die_ * pow(Globals::Discount(), dist / pocman_->num_ghosts_);

			// Penalize for doubling back, but not so much as to prefer hitting a wall
			if (history.Size() >= 2 &&
					Compass::Opposite(history.Action(history.Size() - 1))
					== history.Action(history.Size() - 2))
				value += pocman_->reward_hit_wall_ / 2;

			total_value += state.weight * value;
		}

		return total_value;
	}